

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O0

void os_gen_rand_bytes(uchar *buf,size_t len)

{
  independent_bits_engine<std::random_device,_8UL,_unsigned_char> *in_RDI;
  independent_bits_engine<std::random_device,_8UL,_unsigned_char> eng;
  independent_bits_engine<std::random_device,_8UL,_unsigned_char> *__t;
  independent_bits_engine<std::random_device,_8UL,_unsigned_char> local_1398;
  independent_bits_engine<std::random_device,_8UL,_unsigned_char> *local_8;
  
  __t = &local_1398;
  local_8 = in_RDI;
  std::independent_bits_engine<std::random_device,_8UL,_unsigned_char>::independent_bits_engine
            ((independent_bits_engine<std::random_device,_8UL,_unsigned_char> *)0x1122b5);
  std::ref<std::independent_bits_engine<std::random_device,8ul,unsigned_char>>(__t);
  std::
  generate<unsigned_char*,std::reference_wrapper<std::independent_bits_engine<std::random_device,8ul,unsigned_char>>>
            ((uchar *)__t,(uchar *)0x1122f4,
             (reference_wrapper<std::independent_bits_engine<std::random_device,_8UL,_unsigned_char>_>
              )local_8);
  std::independent_bits_engine<std::random_device,_8UL,_unsigned_char>::~independent_bits_engine
            ((independent_bits_engine<std::random_device,_8UL,_unsigned_char> *)0x112300);
  return;
}

Assistant:

void os_gen_rand_bytes( unsigned char* buf, size_t len )
{
    std::independent_bits_engine
            <std::random_device, CHAR_BIT, unsigned char> eng;
    std::generate(buf, buf + len, std::ref(eng));
}